

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::InsertNode(BpTree<int> *this,IndexNode<int> *Node)

{
  pointer piVar1;
  int iVar2;
  string sStack_98;
  IndexNode<int> local_78;
  
  piVar1 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar1) {
    iVar2 = this->Current_Off + 1;
    this->Current_Off = iVar2;
  }
  else {
    iVar2 = piVar1[-1];
    (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1 + -1;
  }
  (Node->self).FileOff = iVar2;
  std::__cxx11::string::string((string *)&sStack_98,(string *)&this->Index_FileName);
  iVar2 = Buffer::Allocate(&blocks,&sStack_98,(Node->self).FileOff);
  (Node->self).BlockNum = iVar2;
  std::__cxx11::string::~string((string *)&sStack_98);
  IndexNode<int>::IndexNode(&local_78,Node);
  Node2Block(this,&local_78);
  IndexNode<int>::~IndexNode(&local_78);
  return;
}

Assistant:

void BpTree<K>::InsertNode(IndexNode<K>& Node) {
	Addr p;
	if (this->FileOff_bin.empty()) {
		Node.self.FileOff = ++this->Current_Off;
	}
	else{
		Node.self.FileOff = this->FileOff_bin.back();
		this->FileOff_bin.pop_back();
	}
	Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);	//Ϊ�ý������buffer�е�һ���ڴ棬��Ŵ���Block_Num��,������
	this->Node2Block(Node);															//�������Ϣ����鵱��
}